

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

WhereTerm * findTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  Parse *pParse;
  int iVar1;
  WhereClause *pWVar2;
  Expr *pEVar3;
  CollSeq *pCVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  WhereTerm *pWVar11;
  bool bVar12;
  WhereTerm *local_d0;
  long local_c0;
  int aEquiv [22];
  
  aEquiv[0] = iCur;
  aEquiv[1] = iColumn;
  uVar10 = 2;
  local_c0 = 2;
  local_d0 = (WhereTerm *)0x0;
  pWVar2 = pWC;
  iVar7 = iColumn;
  do {
    while (pWVar2 == (WhereClause *)0x0) {
      if ((int)uVar10 <= local_c0) {
        return local_d0;
      }
      iCur = aEquiv[local_c0];
      iVar7 = aEquiv[local_c0 + 1];
      local_c0 = local_c0 + 2;
      pWVar2 = pWC;
    }
    pWVar11 = pWVar2->a;
    iVar8 = pWVar2->nTerm;
    while (bVar12 = iVar8 != 0, iVar8 = iVar8 + -1, bVar12) {
      iVar9 = (int)uVar10;
      if ((pWVar11->leftCursor != iCur) || ((pWVar11->u).leftColumn != iVar7)) goto LAB_0017b79d;
      uVar6 = pWVar11->prereqRight;
      if (((notReady & uVar6) == 0) && ((op & 0xfff & (uint)pWVar11->eOperator) != 0)) {
        if ((char)pWVar11->eOperator < '\0' || (pIdx == (Index *)0x0 || iColumn < 0)) {
LAB_0017b886:
          if ((uVar6 == 0) && ((pWVar11->eOperator & 2) != 0)) {
            return pWVar11;
          }
          if (local_d0 == (WhereTerm *)0x0) {
            local_d0 = pWVar11;
          }
          goto LAB_0017b758;
        }
        pEVar3 = pWVar11->pExpr;
        pParse = pWVar2->pParse;
        iVar1 = sqlite3IndexAffinityOk(pEVar3,pIdx->pTable->aCol[(uint)iColumn].affinity);
        if (iVar1 != 0) {
          pCVar4 = sqlite3BinaryCompareCollSeq(pParse,pEVar3->pLeft,pEVar3->pRight);
          if (pCVar4 == (CollSeq *)0x0) {
            pCVar4 = pParse->db->pDfltColl;
          }
          uVar6 = 0xffffffffffffffff;
          while (pIdx->aiColumn[uVar6 + 1] != iColumn) {
            uVar6 = uVar6 + 1;
            if (pIdx->nColumn <= uVar6) {
              return (WhereTerm *)0x0;
            }
          }
          iVar1 = sqlite3_stricmp(pCVar4->zName,pIdx->azColl[uVar6 + 1]);
          if (iVar1 == 0) {
            uVar6 = pWVar11->prereqRight;
            goto LAB_0017b886;
          }
        }
      }
      else {
LAB_0017b758:
        if ((*(byte *)((long)&pWVar11->eOperator + 1) >> 2 & iVar9 < 0x16) != 0) {
          pEVar3 = sqlite3ExprSkipCollate(pWVar11->pExpr->pRight);
          for (lVar5 = 0;
              (lVar5 < iVar9 &&
              ((aEquiv[lVar5] != pEVar3->iTable || (aEquiv[lVar5 + 1] != (int)pEVar3->iColumn))));
              lVar5 = lVar5 + 2) {
          }
          if (iVar9 == (int)lVar5) {
            aEquiv[uVar10] = pEVar3->iTable;
            aEquiv[uVar10 + 1] = (int)pEVar3->iColumn;
            uVar10 = (ulong)(iVar9 + 2);
          }
        }
      }
LAB_0017b79d:
      pWVar11 = pWVar11 + 1;
    }
    pWVar2 = pWVar2->pOuter;
  } while( true );
}

Assistant:

static WhereTerm *findTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pTerm;            /* Term being examined as possible result */
  WhereTerm *pResult = 0;      /* The answer to return */
  WhereClause *pWCOrig = pWC;  /* Original pWC value */
  int j, k;                    /* Loop counters */
  Expr *pX;                /* Pointer to an expression */
  Parse *pParse;           /* Parsing context */
  int iOrigCol = iColumn;  /* Original value of iColumn */
  int nEquiv = 2;          /* Number of entires in aEquiv[] */
  int iEquiv = 2;          /* Number of entries of aEquiv[] processed so far */
  int aEquiv[22];          /* iCur,iColumn and up to 10 other equivalents */

  assert( iCur>=0 );
  aEquiv[0] = iCur;
  aEquiv[1] = iColumn;
  for(;;){
    for(pWC=pWCOrig; pWC; pWC=pWC->pOuter){
      for(pTerm=pWC->a, k=pWC->nTerm; k; k--, pTerm++){
        if( pTerm->leftCursor==iCur
          && pTerm->u.leftColumn==iColumn
        ){
          if( (pTerm->prereqRight & notReady)==0
           && (pTerm->eOperator & op & WO_ALL)!=0
          ){
            if( iOrigCol>=0 && pIdx && (pTerm->eOperator & WO_ISNULL)==0 ){
              CollSeq *pColl;
              char idxaff;
      
              pX = pTerm->pExpr;
              pParse = pWC->pParse;
              idxaff = pIdx->pTable->aCol[iOrigCol].affinity;
              if( !sqlite3IndexAffinityOk(pX, idxaff) ){
                continue;
              }
      
              /* Figure out the collation sequence required from an index for
              ** it to be useful for optimising expression pX. Store this
              ** value in variable pColl.
              */
              assert(pX->pLeft);
              pColl = sqlite3BinaryCompareCollSeq(pParse,pX->pLeft,pX->pRight);
              if( pColl==0 ) pColl = pParse->db->pDfltColl;
      
              for(j=0; pIdx->aiColumn[j]!=iOrigCol; j++){
                if( NEVER(j>=pIdx->nColumn) ) return 0;
              }
              if( sqlite3StrICmp(pColl->zName, pIdx->azColl[j]) ){
                continue;
              }
            }
            if( pTerm->prereqRight==0 && (pTerm->eOperator&WO_EQ)!=0 ){
              pResult = pTerm;
              goto findTerm_success;
            }else if( pResult==0 ){
              pResult = pTerm;
            }
          }
          if( (pTerm->eOperator & WO_EQUIV)!=0
           && nEquiv<ArraySize(aEquiv)
          ){
            pX = sqlite3ExprSkipCollate(pTerm->pExpr->pRight);
            assert( pX->op==TK_COLUMN );
            for(j=0; j<nEquiv; j+=2){
              if( aEquiv[j]==pX->iTable && aEquiv[j+1]==pX->iColumn ) break;
            }
            if( j==nEquiv ){
              aEquiv[j] = pX->iTable;
              aEquiv[j+1] = pX->iColumn;
              nEquiv += 2;
            }
          }
        }
      }
    }
    if( iEquiv>=nEquiv ) break;
    iCur = aEquiv[iEquiv++];
    iColumn = aEquiv[iEquiv++];
  }
findTerm_success:
  return pResult;
}